

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * __thiscall
units::dimensions_abi_cxx11_(string *__return_storage_ptr__,units *this,precise_unit *units)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  precise_unit base;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58 [2];
  long local_48 [2];
  precise_unit local_38;
  
  if (((byte)this[0xb] & 0x10) == 0) {
    iVar2 = detail::unit_data::unit_type_count((unit_data *)(this + 8));
    if (iVar2 != 0) {
      local_38.base_units_ = *(unit_data *)(this + 8);
      local_38.multiplier_ = 1.0;
      local_38.commodity_ = 0;
      lVar8 = 0;
      do {
        bVar1 = precise_unit::operator==(&local_38,(precise_unit *)(&DAT_001b7660 + lVar8));
        if (bVar1) {
          local_58[0] = local_48;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"[","");
          plVar3 = (long *)std::__cxx11::string::append((char *)local_58);
          plVar4 = plVar3 + 2;
          if ((long *)*plVar3 == plVar4) {
            local_68 = *plVar4;
            lStack_60 = plVar3[3];
            local_78 = &local_68;
          }
          else {
            local_68 = *plVar4;
            local_78 = (long *)*plVar3;
          }
          local_70 = plVar3[1];
          *plVar3 = (long)plVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          psVar5 = (size_type *)(plVar3 + 2);
          if ((size_type *)*plVar3 == psVar5) {
            lVar8 = plVar3[3];
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
            *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar8;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
          }
          __return_storage_ptr__->_M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          if (local_78 != &local_68) {
            operator_delete(local_78,local_68 + 1);
          }
          if (local_58[0] == local_48) {
            return __return_storage_ptr__;
          }
          operator_delete(local_58[0],local_48[0] + 1);
          return __return_storage_ptr__;
        }
        lVar8 = lVar8 + 0x18;
      } while (lVar8 != 0x1788);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = "[unknown]";
      pcVar6 = "";
      goto LAB_0016da10;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar7 = "[dimensionless]";
  pcVar6 = "";
LAB_0016da10:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string dimensions(const precise_unit& units)
{
    if (units.is_per_unit() || units.unit_type_count() == 0) {
        return "[dimensionless]";
    }

    precise_unit base(1.0, units.base_units());
    for (const auto& mt : defined_measurement_types) {
        if (base == mt.second) {
            return std::string("[") + mt.first + "]";
        }
    }
    // Now it isn't something common so lets just build a sequence TODO(PT):
    return "[unknown]";
}